

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvDisc_dns.c
# Opt level: O1

int main(void)

{
  uint uVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  char *pcVar5;
  sunrealtype t;
  void *cvode_mem;
  int flag;
  long nst1;
  SUNContext sunctx;
  long nst2;
  long nst;
  double local_68;
  long local_60;
  undefined4 local_54;
  long local_50;
  undefined8 local_48;
  long local_40;
  long local_38;
  
  uVar1 = SUNContext_Create(0,&local_48);
  if ((int)uVar1 < 0) {
    pcVar5 = "SUNContext_Create";
    goto LAB_00101aaf;
  }
  plVar2 = (long *)N_VNew_Serial(1,local_48);
  **(undefined8 **)(*plVar2 + 0x10) = 0x3ff0000000000000;
  local_60 = CVodeCreate(2,local_48);
  if (local_60 == 0) {
    main_cold_3();
    return 1;
  }
  uVar1 = CVodeInit(0,local_60,f,plVar2);
  if ((int)uVar1 < 0) {
    pcVar5 = "CVodeInit";
    goto LAB_00101aaf;
  }
  uVar1 = CVodeSStolerances(0x3f50624dd2f1a9fc,0x3f1a36e2eb1c432d,local_60);
  if ((int)uVar1 < 0) {
    pcVar5 = "CVodeSStolerances";
    goto LAB_00101aaf;
  }
  uVar1 = CVodeSetUserData(local_60,&local_54);
  if ((int)uVar1 < 0) {
    pcVar5 = "CVodeSetUserData";
    goto LAB_00101aaf;
  }
  lVar3 = SUNDenseMatrix(1,1,local_48);
  if (lVar3 == 0) {
    main_cold_2();
    return 1;
  }
  lVar4 = SUNLinSol_Dense(plVar2,lVar3,local_48);
  if (lVar4 == 0) {
    main_cold_1();
    return 1;
  }
  uVar1 = CVodeSetLinearSolver(local_60,lVar4,lVar3);
  if ((int)uVar1 < 0) {
    pcVar5 = "CVodeSetLinearSolver";
    goto LAB_00101aaf;
  }
  puts("\nDiscontinuity in solution\n");
  uVar1 = CVodeSetStopTime(0x3ff0000000000000,local_60);
  if ((int)uVar1 < 0) goto LAB_001019a6;
  local_54 = 1;
  local_68 = 0.0;
  printf("%12.8e  %12.8e\n",0,**(undefined8 **)(*plVar2 + 0x10));
  while (local_68 < 1.0) {
    uVar1 = CVode(local_60,plVar2,&local_68,2);
    if ((int)uVar1 < 0) goto LAB_001019fd;
    printf("%12.8e  %12.8e\n",local_68,**(undefined8 **)(*plVar2 + 0x10));
  }
  uVar1 = CVodeGetNumSteps(local_60,&local_50);
  if ((int)uVar1 < 0) goto LAB_001019c3;
  **(undefined8 **)(*plVar2 + 0x10) = 0x3ff0000000000000;
  uVar1 = CVodeReInit(0x3ff0000000000000,local_60,plVar2);
  if ((int)uVar1 < 0) {
LAB_001019e0:
    pcVar5 = "CVodeReInit";
    goto LAB_00101aaf;
  }
  uVar1 = CVodeSetStopTime(0x4000000000000000,local_60);
  if ((int)uVar1 < 0) goto LAB_001019a6;
  local_54 = 1;
  local_68 = 1.0;
  printf("%12.8e  %12.8e\n",0x3ff0000000000000,**(undefined8 **)(*plVar2 + 0x10));
  while (local_68 < 2.0) {
    uVar1 = CVode(local_60,plVar2,&local_68,2);
    if ((int)uVar1 < 0) goto LAB_001019fd;
    printf("%12.8e  %12.8e\n",local_68,**(undefined8 **)(*plVar2 + 0x10));
  }
  uVar1 = CVodeGetNumSteps(local_60,&local_40);
  if ((int)uVar1 < 0) goto LAB_001019c3;
  local_38 = local_40 + local_50;
  printf("\nNumber of steps: %ld + %ld = %ld\n");
  puts("\nDiscontinuity in RHS: Case 1 - explicit treatment\n");
  **(undefined8 **)(*plVar2 + 0x10) = 0x3ff0000000000000;
  uVar1 = CVodeReInit(0,local_60,plVar2);
  if ((int)uVar1 < 0) goto LAB_001019e0;
  uVar1 = CVodeSetStopTime(0x3ff0000000000000,local_60);
  if ((int)uVar1 < 0) {
LAB_001019a6:
    pcVar5 = "CVodeSetStopTime";
  }
  else {
    local_54 = 1;
    local_68 = 0.0;
    printf("%12.8e  %12.8e\n",0,**(undefined8 **)(*plVar2 + 0x10));
    while (local_68 < 1.0) {
      uVar1 = CVode(local_60,plVar2,&local_68,2);
      if ((int)uVar1 < 0) goto LAB_001019fd;
      printf("%12.8e  %12.8e\n",local_68,**(undefined8 **)(*plVar2 + 0x10));
    }
    uVar1 = CVodeGetNumSteps(local_60,&local_50);
    if (-1 < (int)uVar1) {
      CVodeReInit(0x3ff0000000000000,local_60,plVar2);
      uVar1 = CVodeSetStopTime(0x4000000000000000,local_60);
      if ((int)uVar1 < 0) goto LAB_001019a6;
      local_54 = 2;
      local_68 = 1.0;
      printf("%12.8e  %12.8e\n",0x3ff0000000000000,**(undefined8 **)(*plVar2 + 0x10));
      while (local_68 < 2.0) {
        uVar1 = CVode(local_60,plVar2,&local_68,2);
        if ((int)uVar1 < 0) goto LAB_001019fd;
        printf("%12.8e  %12.8e\n",local_68,**(undefined8 **)(*plVar2 + 0x10));
      }
      uVar1 = CVodeGetNumSteps(local_60,&local_40);
      if (-1 < (int)uVar1) {
        local_38 = local_40 + local_50;
        printf("\nNumber of steps: %ld + %ld = %ld\n");
        puts("\nDiscontinuity in RHS: Case 2 - let CVODE deal with it\n");
        **(undefined8 **)(*plVar2 + 0x10) = 0x3ff0000000000000;
        uVar1 = CVodeReInit(0,local_60,plVar2);
        if ((int)uVar1 < 0) goto LAB_001019e0;
        uVar1 = CVodeSetStopTime(0x3ff0000000000000,local_60);
        if ((int)uVar1 < 0) goto LAB_001019a6;
        local_54 = 1;
        local_68 = 0.0;
        printf("%12.8e  %12.8e\n",0,**(undefined8 **)(*plVar2 + 0x10));
        while (local_68 < 1.0) {
          uVar1 = CVode(local_60,plVar2,&local_68,2);
          if ((int)uVar1 < 0) goto LAB_001019fd;
          printf("%12.8e  %12.8e\n",local_68,**(undefined8 **)(*plVar2 + 0x10));
        }
        uVar1 = CVodeGetNumSteps(local_60,&local_50);
        if (-1 < (int)uVar1) {
          uVar1 = CVodeSetStopTime(0x4000000000000000,local_60);
          if ((int)uVar1 < 0) goto LAB_001019a6;
          local_54 = 2;
          local_68 = 1.0;
          printf("%12.8e  %12.8e\n",0x3ff0000000000000,**(undefined8 **)(*plVar2 + 0x10));
          while (local_68 < 2.0) {
            uVar1 = CVode(local_60,plVar2,&local_68,2);
            if ((int)uVar1 < 0) goto LAB_001019fd;
            printf("%12.8e  %12.8e\n",local_68,**(undefined8 **)(*plVar2 + 0x10));
          }
          uVar1 = CVodeGetNumSteps(local_60,&local_38);
          if (-1 < (int)uVar1) {
            local_40 = local_38 - local_50;
            printf("\nNumber of steps: %ld + %ld = %ld\n");
            N_VDestroy(plVar2);
            SUNMatDestroy(lVar3);
            SUNLinSolFree(lVar4);
            CVodeFree(&local_60);
            SUNContext_Free(&local_48);
            return 0;
          }
        }
      }
    }
LAB_001019c3:
    pcVar5 = "CvodeGetNumSteps";
  }
LAB_00101aaf:
  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",pcVar5,(ulong)uVar1);
  return 1;
LAB_001019fd:
  pcVar5 = "CVode";
  goto LAB_00101aaf;
}

Assistant:

int main(void)
{
  void* cvode_mem;
  SUNMatrix A;
  SUNLinearSolver LS;
  SUNContext sunctx;

  N_Vector y;
  int flag, retval;
  sunrealtype reltol, abstol, t0, t1, t2, t;
  long int nst1, nst2, nst;

  reltol = SUN_RCONST(1.0e-3);
  abstol = SUN_RCONST(1.0e-4);

  t0 = SUN_RCONST(0.0);
  t1 = SUN_RCONST(1.0);
  t2 = SUN_RCONST(2.0);

  /* Create the SUNDIALS context */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* Allocate the vector of initial conditions */
  y = N_VNew_Serial(NEQ, sunctx);

  /* Set initial condition */
  NV_Ith_S(y, 0) = SUN_RCONST(1.0);

  /*
   * ------------------------------------------------------------
   *  Shared initialization and setup
   * ------------------------------------------------------------
   */

  /* Call CVodeCreate to create CVODE memory block and specify the
   * Backward Differentiaion Formula */
  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval((void*)cvode_mem, "CVodeCreate", 0)) { return (1); }

  /* Call CVodeInit to initialize integrator memory and specify the
   * user's right hand side function y'=f(t,y), the initial time T0
   * and the initial condiition vector y. */
  retval = CVodeInit(cvode_mem, f, t0, y);
  if (check_retval((void*)&retval, "CVodeInit", 1)) { return (1); }

  /* Call CVodeSStolerances to specify integration tolereances,
   * specifically the scalar relative and absolute tolerance. */
  retval = CVodeSStolerances(cvode_mem, reltol, abstol);
  if (check_retval((void*)&retval, "CVodeSStolerances", 1)) { return (1); }

  /* Provide RHS flag as user data which can be access in user provided routines */
  retval = CVodeSetUserData(cvode_mem, &flag);
  if (check_retval((void*)&retval, "CVodeSetUserData", 1)) { return (1); }

  /* Create dense SUNMatrix for use in linear solver */
  A = SUNDenseMatrix(NEQ, NEQ, sunctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense linear solver for use by CVode */
  LS = SUNLinSol_Dense(y, A, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the linear solver and matrix to CVode by calling CVodeSetLinearSolver */
  retval = CVodeSetLinearSolver(cvode_mem, LS, A);
  if (check_retval((void*)&retval, "CVodeSetLinearSolver", 1)) { return (1); }

  /*
   * ---------------------------------------------------------------
   * Discontinuity in the solution
   *
   * 1) Integrate to the discontinuity
   * 2) Integrate from the discontinuity
   * ---------------------------------------------------------------
   */

  /* ---- Integrate to the discontinuity */

  printf("\nDiscontinuity in solution\n\n");

  /* set TSTOP (max time solution proceeds to) - this is not required */
  retval = CVodeSetStopTime(cvode_mem, t1);
  if (check_retval((void*)&retval, "CVodeSetStopTime", 1)) { return (1); }

  flag = RHS1; /* use -y for RHS */
  t    = t0;   /* set the integrator start time */

  printf("%12.8" ESYM "  %12.8" ESYM "\n", t, NV_Ith_S(y, 0));
  while (t < t1)
  {
    /* advance solver just one internal step */
    retval = CVode(cvode_mem, t1, y, &t, CV_ONE_STEP);
    if (check_retval((void*)&retval, "CVode", 1)) { return (1); }
    printf("%12.8" ESYM "  %12.8" ESYM "\n", t, NV_Ith_S(y, 0));
  }
  /* Get the number of steps the solver took to get to the discont. */
  retval = CVodeGetNumSteps(cvode_mem, &nst1);
  if (check_retval((void*)&retval, "CvodeGetNumSteps", 1)) { return (1); }

  /* ---- Integrate from the discontinuity */

  /* Include discontinuity */
  NV_Ith_S(y, 0) = SUN_RCONST(1.0);

  /* Reinitialize the solver */
  retval = CVodeReInit(cvode_mem, t1, y);
  if (check_retval((void*)&retval, "CVodeReInit", 1)) { return (1); }

  /* set TSTOP (max time solution proceeds to) - this is not required */
  retval = CVodeSetStopTime(cvode_mem, t2);
  if (check_retval((void*)&retval, "CVodeSetStopTime", 1)) { return (1); }

  flag = RHS1; /* use -y for RHS */
  t    = t1;   /* set the integrator start time */

  printf("%12.8" ESYM "  %12.8" ESYM "\n", t, NV_Ith_S(y, 0));

  while (t < t2)
  {
    /* advance solver just one internal step */
    retval = CVode(cvode_mem, t2, y, &t, CV_ONE_STEP);
    if (check_retval((void*)&retval, "CVode", 1)) { return (1); }
    printf("%12.8" ESYM "  %12.8" ESYM "\n", t, NV_Ith_S(y, 0));
  }

  /* Get the number of steps the solver took after the discont. */
  retval = CVodeGetNumSteps(cvode_mem, &nst2);
  if (check_retval((void*)&retval, "CvodeGetNumSteps", 1)) { return (1); }

  /* Print statistics */
  nst = nst1 + nst2;
  printf("\nNumber of steps: %ld + %ld = %ld\n", nst1, nst2, nst);

  /*
   * ---------------------------------------------------------------
   * Discontinuity in RHS: Case 1 - explicit treatment
   * Note that it is not required to set TSTOP, but without it
   * we would have to find y(t1) to reinitialize the solver.
   * ---------------------------------------------------------------
   */

  printf("\nDiscontinuity in RHS: Case 1 - explicit treatment\n\n");

  /* Set initial condition */
  NV_Ith_S(y, 0) = SUN_RCONST(1.0);

  /* Reinitialize the solver. CVodeReInit does not reallocate memory
   * so it can only be used when the new problem size is the same as
   * the problem size when CVodeCreate was called. */
  retval = CVodeReInit(cvode_mem, t0, y);
  if (check_retval((void*)&retval, "CVodeReInit", 1)) { return (1); }

  /* ---- Integrate to the discontinuity */

  /* Set TSTOP (max time solution proceeds to) to location of discont. */
  retval = CVodeSetStopTime(cvode_mem, t1);
  if (check_retval((void*)&retval, "CVodeSetStopTime", 1)) { return (1); }

  flag = RHS1; /* use -y for RHS */
  t    = t0;   /* set the integrator start time */

  printf("%12.8" ESYM "  %12.8" ESYM "\n", t, NV_Ith_S(y, 0));
  while (t < t1)
  {
    /* advance solver just one internal step */
    retval = CVode(cvode_mem, t1, y, &t, CV_ONE_STEP);
    if (check_retval((void*)&retval, "CVode", 1)) { return (1); }
    printf("%12.8" ESYM "  %12.8" ESYM "\n", t, NV_Ith_S(y, 0));
  }

  /* Get the number of steps the solver took to get to the discont. */
  retval = CVodeGetNumSteps(cvode_mem, &nst1);
  if (check_retval((void*)&retval, "CvodeGetNumSteps", 1)) { return (1); }

  /* If TSTOP was not set, we'd need to find y(t1): */
  /* CVodeGetDky(cvode_mem, t1, 0, y); */

  /* ---- Integrate from the discontinuity */

  /* Reinitialize solver */
  retval = CVodeReInit(cvode_mem, t1, y);

  /* set TSTOP (max time solution proceeds to) - this is not required */
  retval = CVodeSetStopTime(cvode_mem, t2);
  if (check_retval((void*)&retval, "CVodeSetStopTime", 1)) { return (1); }

  flag = RHS2; /* use -5y for RHS */
  t    = t1;   /* set the integrator start time */

  printf("%12.8" ESYM "  %12.8" ESYM "\n", t, NV_Ith_S(y, 0));

  while (t < t2)
  {
    /* advance solver just one internal step */
    retval = CVode(cvode_mem, t2, y, &t, CV_ONE_STEP);
    if (check_retval((void*)&retval, "CVode", 1)) { return (1); }
    printf("%12.8" ESYM "  %12.8" ESYM "\n", t, NV_Ith_S(y, 0));
  }

  /* Get the number of steps the solver took after the discont. */
  retval = CVodeGetNumSteps(cvode_mem, &nst2);
  if (check_retval((void*)&retval, "CvodeGetNumSteps", 1)) { return (1); }

  /* Print statistics */
  nst = nst1 + nst2;
  printf("\nNumber of steps: %ld + %ld = %ld\n", nst1, nst2, nst);

  /*
   * ---------------------------------------------------------------
   * Discontinuity in RHS: Case 2 - let CVODE deal with it
   * Note that here we MUST set TSTOP to ensure that the
   * change in the RHS happens at the appropriate time
   * ---------------------------------------------------------------
   */

  printf("\nDiscontinuity in RHS: Case 2 - let CVODE deal with it\n\n");

  /* Set initial condition */
  NV_Ith_S(y, 0) = SUN_RCONST(1.0);

  /* Reinitialize the solver. CVodeReInit does not reallocate memory
   * so it can only be used when the new problem size is the same as
   * the problem size when CVodeCreate was called. */
  retval = CVodeReInit(cvode_mem, t0, y);
  if (check_retval((void*)&retval, "CVodeReInit", 1)) { return (1); }

  /* ---- Integrate to the discontinuity */

  /* Set TSTOP (max time solution proceeds to) to location of discont. */
  retval = CVodeSetStopTime(cvode_mem, t1);
  if (check_retval((void*)&retval, "CVodeSetStopTime", 1)) { return (1); }

  flag = RHS1; /* use -y for RHS */
  t    = t0;   /* set the integrator start time */

  printf("%12.8" ESYM "  %12.8" ESYM "\n", t, NV_Ith_S(y, 0));
  while (t < t1)
  {
    /* advance solver just one internal step */
    retval = CVode(cvode_mem, t1, y, &t, CV_ONE_STEP);
    if (check_retval((void*)&retval, "CVode", 1)) { return (1); }
    printf("%12.8" ESYM "  %12.8" ESYM "\n", t, NV_Ith_S(y, 0));
  }

  /* Get the number of steps the solver took to get to the discont. */
  retval = CVodeGetNumSteps(cvode_mem, &nst1);
  if (check_retval((void*)&retval, "CvodeGetNumSteps", 1)) { return (1); }

  /* ---- Integrate from the discontinuity */

  /* set TSTOP (max time solution proceeds to) - this is not required */
  retval = CVodeSetStopTime(cvode_mem, t2);
  if (check_retval((void*)&retval, "CVodeSetStopTime", 1)) { return (1); }

  flag = RHS2; /* use -5y for RHS */
  t    = t1;   /* set the integrator start time */

  printf("%12.8" ESYM "  %12.8" ESYM "\n", t, NV_Ith_S(y, 0));

  while (t < t2)
  {
    /* advance solver just one internal step */
    retval = CVode(cvode_mem, t2, y, &t, CV_ONE_STEP);
    if (check_retval((void*)&retval, "CVode", 1)) { return (1); }
    printf("%12.8" ESYM "  %12.8" ESYM "\n", t, NV_Ith_S(y, 0));
  }

  /* Get the number of steps the solver took after the discont. */
  retval = CVodeGetNumSteps(cvode_mem, &nst);
  if (check_retval((void*)&retval, "CvodeGetNumSteps", 1)) { return (1); }

  /* Print statistics */
  nst2 = nst - nst1;
  printf("\nNumber of steps: %ld + %ld = %ld\n", nst1, nst2, nst);

  /* Free memory */
  N_VDestroy(y);
  SUNMatDestroy(A);
  SUNLinSolFree(LS);
  CVodeFree(&cvode_mem);
  SUNContext_Free(&sunctx);

  return (0);
}